

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

void __thiscall
CaDiCaL::heap<CaDiCaL::score_smaller>::exchange(heap<CaDiCaL::score_smaller> *this,uint a,uint b)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  uint *puVar4;
  uint *puVar5;
  int __c;
  undefined4 in_register_00000034;
  
  puVar4 = (uint *)index(this,(char *)CONCAT44(in_register_00000034,a),b);
  puVar5 = (uint *)index(this,(char *)(ulong)b,__c);
  puVar3 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = *puVar5;
  uVar2 = puVar3[*puVar4];
  puVar3[*puVar4] = puVar3[uVar1];
  puVar3[uVar1] = uVar2;
  uVar1 = *puVar4;
  *puVar4 = *puVar5;
  *puVar5 = uVar1;
  return;
}

Assistant:

void exchange (unsigned a, unsigned b) {
    unsigned &i = index (a), &j = index (b);
    swap (array[i], array[j]);
    swap (i, j);
  }